

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdLut.c
# Opt level: O2

int Sbd_ProblemAddClauses(sat_solver *pSat,int nVars,int nStrs,int *pVars,Sbd_Str_t *pStr0)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Sbd_Str_t *pSVar4;
  uint c;
  long lVar5;
  char *__assertion;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  int pLits [6];
  
  uVar8 = (ulong)(uint)(nStrs + nVars);
  pSVar4 = pStr0 + nStrs;
  lVar7 = (long)nVars;
  do {
    if (pSVar4 <= pStr0) {
      return 1;
    }
    iVar3 = pStr0->nVarIns;
    if (pStr0->fLut == 0) {
      if (10 < iVar3) {
        __assertion = "pStr->nVarIns <= SBD_DIV_MAX";
        uVar6 = 0x54;
        goto LAB_0045c683;
      }
      uVar8 = (ulong)(int)uVar8;
      for (lVar5 = 0; lVar5 < iVar3; lVar5 = lVar5 + 1) {
        uVar6 = 0;
        while (uVar6 != 2) {
          pLits[0] = Abc_Var2Lit(pVars[uVar8],1);
          pLits[1] = Abc_Var2Lit(pVars[lVar7],uVar6);
          pLits[2] = Abc_Var2Lit(pVars[pStr0->VarIns[lVar5]],uVar6 ^ 1);
          iVar3 = sat_solver_addclause(pSat,pLits,pLits + 3);
          uVar6 = uVar6 + 1;
          if (iVar3 == 0) {
            return 0;
          }
        }
        uVar8 = uVar8 + 1;
        iVar3 = pStr0->nVarIns;
      }
    }
    else {
      if (6 < iVar3) {
        __assertion = "pStr->nVarIns <= 6";
        uVar6 = 0x43;
LAB_0045c683:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdLut.c"
                      ,uVar6,"int Sbd_ProblemAddClauses(sat_solver *, int, int, int *, Sbd_Str_t *)"
                     );
      }
      uVar8 = (ulong)(int)uVar8;
      for (uVar6 = 0; uVar6 != 1 << ((byte)iVar3 & 0x1f); uVar6 = uVar6 + 1) {
        for (lVar5 = 0; lVar5 < pStr0->nVarIns; lVar5 = lVar5 + 1) {
          iVar1 = Abc_Var2Lit(pVars[pStr0->VarIns[lVar5]],
                              (uint)((uVar6 >> ((uint)lVar5 & 0x1f) & 1) != 0));
          pLits[lVar5] = iVar1;
        }
        c = 0;
        while (c != 2) {
          iVar1 = Abc_Var2Lit(pVars[uVar8],c);
          pLits[pStr0->nVarIns] = iVar1;
          iVar2 = Abc_Var2Lit(pVars[lVar7],c ^ 1);
          iVar1 = pStr0->nVarIns;
          pLits[(long)iVar1 + 1] = iVar2;
          iVar1 = sat_solver_addclause(pSat,pLits,pLits + (long)iVar1 + 2);
          c = c + 1;
          if (iVar1 == 0) {
            return 0;
          }
        }
        uVar8 = uVar8 + 1;
      }
    }
    pStr0 = pStr0 + 1;
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

int Sbd_ProblemAddClauses( sat_solver * pSat, int nVars, int nStrs, int * pVars, Sbd_Str_t * pStr0 )
{   
    // variable order:  inputs, structure outputs, parameters
    Sbd_Str_t * pStr;
    int VarOut = nVars;
    int VarPar = nVars + nStrs;
    int m, k, n, status, pLits[SBD_SIZE_MAX+2];
//printf( "Start par = %d.  ", VarPar );
    for ( pStr = pStr0; pStr < pStr0 + nStrs; pStr++, VarOut++ )
    {
        if ( pStr->fLut )
        {
            int nMints = 1 << pStr->nVarIns;
            assert( pStr->nVarIns <= 6 );
            for ( m = 0; m < nMints; m++, VarPar++ )
            {
                for ( k = 0; k < pStr->nVarIns; k++ )
                    pLits[k] = Abc_Var2Lit( pVars[pStr->VarIns[k]], (m >> k) & 1 ); 
                for ( n = 0; n < 2; n++ )
                {
                    pLits[pStr->nVarIns]   = Abc_Var2Lit( pVars[VarPar], n );
                    pLits[pStr->nVarIns+1] = Abc_Var2Lit( pVars[VarOut], !n );
                    status = sat_solver_addclause( pSat, pLits, pLits + pStr->nVarIns + 2 );
                    if ( !status )
                        return 0;
                }
            }
        }
        else
        {
            assert( pStr->nVarIns <= SBD_DIV_MAX );
            for ( k = 0; k < pStr->nVarIns; k++, VarPar++ )
            {
                for ( n = 0; n < 2; n++ )
                {
                    pLits[0] = Abc_Var2Lit( pVars[VarPar], 1 );
                    pLits[1] = Abc_Var2Lit( pVars[VarOut], n );
                    pLits[2] = Abc_Var2Lit( pVars[pStr->VarIns[k]], !n );
                    status = sat_solver_addclause( pSat, pLits, pLits + 3 );
                    if ( !status )
                        return 0;
                }
            }
        }
    }
    return 1;
}